

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oop_interface.hpp
# Opt level: O0

void __thiscall isotree::IsolationForest::~IsolationForest(IsolationForest *this)

{
  Imputer *in_RDI;
  
  TreesIndexer::~TreesIndexer((TreesIndexer *)0x62ca4f);
  Imputer::~Imputer(in_RDI);
  ExtIsoForest::~ExtIsoForest((ExtIsoForest *)0x62ca71);
  IsoForest::~IsoForest((IsoForest *)0x62ca82);
  return;
}

Assistant:

~IsolationForest() = default;